

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<unsigned_int,4ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,array<unsigned_int,_4UL> *v)

{
  undefined8 uVar1;
  bool bVar2;
  pointer pSVar3;
  value_type *pvVar4;
  pointer pSVar5;
  optional<std::array<unsigned_int,_4UL>_> pv;
  optional<std::array<unsigned_int,_4UL>_> local_48;
  optional<std::array<unsigned_int,_4UL>_> local_34;
  
  if (v == (array<unsigned_int,_4UL> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_default_value<std::array<unsigned_int,4ul>>(&local_48,this);
    local_34.has_value_ = local_48.has_value_;
    if (local_48.has_value_ == true) goto LAB_001bd210;
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar3 == pSVar5) {
      return false;
    }
  }
  else {
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar5 != pSVar3) {
    bVar2 = tinyusdz::value::TimeSamples::get<std::array<unsigned_int,_4UL>,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  bVar2 = has_value(this);
  if (bVar2) {
    get_default_value<std::array<unsigned_int,4ul>>(&local_48,this);
    local_34.has_value_ = local_48.has_value_;
    if (local_48.has_value_ != false) {
LAB_001bd210:
      local_34.contained._0_8_ = local_48.contained._0_8_;
      local_34.contained._8_8_ = local_48.contained._8_8_;
      pvVar4 = nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::value(&local_34);
      uVar1 = *(undefined8 *)(pvVar4->_M_elems + 2);
      *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar4->_M_elems;
      *(undefined8 *)(v->_M_elems + 2) = uVar1;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }